

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterfaceValidators.cpp
# Opt level: O3

Result * CoreML::validateFeatureDescription
                   (Result *__return_storage_ptr__,FeatureDescription *desc,int modelVersion,
                   bool isInput)

{
  RepeatedPtrField<CoreML::Specification::ArrayFeatureType_Shape> *this;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  uint32 uVar5;
  FeatureType *pFVar6;
  Rep *pRVar7;
  ArrayFeatureType_EnumeratedShapes *pAVar8;
  uint uVar9;
  bool bVar10;
  int iVar11;
  undefined8 *puVar12;
  long lVar13;
  long *plVar14;
  Type *pTVar15;
  ImageFeatureType *pIVar16;
  ArrayFeatureType *pAVar17;
  string *psVar18;
  Type *pTVar19;
  ImageFeatureType_ImageSizeRange *pIVar20;
  ImageFeatureType_EnumeratedImageSizes *pIVar21;
  uint uVar22;
  undefined8 *puVar23;
  long lVar24;
  void **ppvVar25;
  ulong uVar26;
  ulong uVar27;
  uint uVar28;
  SizeRange *pSVar29;
  undefined8 uVar30;
  pointer pcVar31;
  _Alloc_hider _Var32;
  RepeatedField<long> *pRVar33;
  uint uVar34;
  Result res;
  string __str_1;
  string __str;
  undefined1 local_160 [8];
  _Alloc_hider local_158;
  undefined1 local_150 [24];
  undefined1 local_138 [8];
  _Alloc_hider local_130;
  undefined1 local_128 [24];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  string local_d0;
  RepeatedField<long> *local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  ulong local_88;
  string local_80;
  SizeRange *local_60;
  string local_58;
  void **local_38;
  
  uVar27 = (ulong)(uint)modelVersion;
  iVar11 = std::__cxx11::string::compare((char *)(desc->name_).ptr_);
  if (iVar11 == 0) {
    local_160 = (undefined1  [8])local_150;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_160,"Feature description must have a non-empty name.","");
    Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,(string *)local_160);
    local_a8.field_2._M_allocated_capacity = local_150._0_8_;
    local_a8._M_dataplus._M_p = (pointer)local_160;
    if (local_160 == (undefined1  [8])local_150) {
      return __return_storage_ptr__;
    }
    goto LAB_0028911b;
  }
  pFVar6 = desc->type_;
  if (desc == (FeatureDescription *)&Specification::_FeatureDescription_default_instance_ ||
      pFVar6 == (FeatureType *)0x0) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_138,
                   "Feature description ",(desc->name_).ptr_);
    puVar12 = (undefined8 *)std::__cxx11::string::append((char *)local_138);
    local_160 = (undefined1  [8])local_150;
    puVar23 = puVar12 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar12 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar23) {
      local_150._0_8_ = *puVar23;
      local_150._8_8_ = puVar12[3];
    }
    else {
      local_150._0_8_ = *puVar23;
      local_160 = (undefined1  [8])*puVar12;
    }
    local_158._M_p = (pointer)puVar12[1];
    *puVar12 = puVar23;
    puVar12[1] = 0;
    *(undefined1 *)(puVar12 + 2) = 0;
    Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,(string *)local_160);
  }
  else {
    switch(pFVar6->_oneof_case_[0]) {
    case 0:
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_138,
                     "Feature description has an unspecified or invalid type for feature \'",
                     (desc->name_).ptr_);
      puVar12 = (undefined8 *)std::__cxx11::string::append((char *)local_138);
      local_160 = (undefined1  [8])local_150;
      puVar23 = puVar12 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar12 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar23) {
        local_150._0_8_ = *puVar23;
        local_150._8_8_ = puVar12[3];
      }
      else {
        local_150._0_8_ = *puVar23;
        local_160 = (undefined1  [8])*puVar12;
      }
      local_158._M_p = (pointer)puVar12[1];
      *puVar12 = puVar23;
      puVar12[1] = 0;
      *(undefined1 *)(puVar12 + 2) = 0;
      Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,(string *)local_160);
      break;
    default:
      goto switchD_00288fd2_caseD_1;
    case 4:
      pIVar16 = (pFVar6->Type_).imagetype_;
      uVar26 = pIVar16->width_;
      pRVar33 = (RepeatedField<long> *)pIVar16->height_;
      if (2 < modelVersion) {
        if (pIVar16->_oneof_case_[0] == 0x1f) {
          pSVar29 = ((pIVar16->SizeFlexibility_).imagesizerange_)->widthrange_;
          if (pSVar29 == (SizeRange *)0x0) {
            pSVar29 = (SizeRange *)&Specification::_SizeRange_default_instance_;
          }
          local_b0 = pRVar33;
          local_88 = uVar27;
          validateSizeRange((Result *)local_160,pSVar29);
          bVar10 = Result::good((Result *)local_160);
          if (bVar10) {
            if (pFVar6->_oneof_case_[0] == 4) {
              pIVar16 = (pFVar6->Type_).imagetype_;
            }
            else {
              pIVar16 = Specification::ImageFeatureType::default_instance();
            }
            if (pIVar16->_oneof_case_[0] == 0x1f) {
              pIVar20 = (pIVar16->SizeFlexibility_).imagesizerange_;
            }
            else {
              pIVar20 = Specification::ImageFeatureType_ImageSizeRange::default_instance();
            }
            local_60 = pIVar20->heightrange_;
            if (local_60 == (SizeRange *)0x0) {
              local_60 = (SizeRange *)&Specification::_SizeRange_default_instance_;
            }
            validateSizeRange((Result *)local_138,local_60);
            local_160 = local_138;
            std::__cxx11::string::operator=((string *)&local_158,(string *)&local_130);
            if (local_130._M_p != local_128 + 8) {
              operator_delete(local_130._M_p,local_128._8_8_ + 1);
            }
            bVar10 = Result::good((Result *)local_160);
            modelVersion = (int)local_88;
            if (!bVar10) {
              std::operator+(&local_f0,"Description of image feature \'",(desc->name_).ptr_);
              puVar12 = (undefined8 *)std::__cxx11::string::append((char *)&local_f0);
              local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
              puVar23 = puVar12 + 2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar12 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)puVar23) {
                local_110.field_2._M_allocated_capacity = *puVar23;
                local_110.field_2._8_8_ = puVar12[3];
              }
              else {
                local_110.field_2._M_allocated_capacity = *puVar23;
                local_110._M_dataplus._M_p = (pointer)*puVar12;
              }
              local_110._M_string_length = puVar12[1];
              *puVar12 = puVar23;
              puVar12[1] = 0;
              *(undefined1 *)(puVar12 + 2) = 0;
              psVar18 = Result::message_abi_cxx11_((Result *)local_160);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_138,&local_110,psVar18);
              Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,(string *)local_138);
              goto LAB_0028a911;
            }
            uVar27 = pSVar29->lowerbound_;
            if (0 < (long)uVar26 && 0 < (long)pRVar33) {
              if (((long)uVar26 < (long)uVar27) ||
                 ((-1 < pSVar29->upperbound_ && ((ulong)pSVar29->upperbound_ < uVar26)))) {
                std::operator+(&local_d0,"Description of image feature \'",(desc->name_).ptr_);
                puVar12 = (undefined8 *)std::__cxx11::string::append((char *)&local_d0);
                local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
                puVar23 = puVar12 + 2;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*puVar12 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)puVar23) {
                  local_f0.field_2._M_allocated_capacity = *puVar23;
                  local_f0.field_2._8_8_ = puVar12[3];
                }
                else {
                  local_f0.field_2._M_allocated_capacity = *puVar23;
                  local_f0._M_dataplus._M_p = (pointer)*puVar12;
                }
                local_f0._M_string_length = puVar12[1];
                *puVar12 = puVar23;
                puVar12[1] = 0;
                *(undefined1 *)(puVar12 + 2) = 0;
                std::__cxx11::to_string(&local_a8,uVar26);
                std::operator+(&local_110,&local_f0,&local_a8);
                puVar12 = (undefined8 *)std::__cxx11::string::append((char *)&local_110);
                local_138 = (undefined1  [8])local_128;
                puVar23 = puVar12 + 2;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*puVar12 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)puVar23) {
                  local_128._0_8_ = *puVar23;
                  local_128._8_8_ = puVar12[3];
                }
                else {
                  local_128._0_8_ = *puVar23;
                  local_138 = (undefined1  [8])*puVar12;
                }
                local_130._M_p = (pointer)puVar12[1];
                *puVar12 = puVar23;
                puVar12[1] = 0;
                *(undefined1 *)(puVar12 + 2) = 0;
                Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,(string *)local_138);
              }
              else {
                if ((long)local_60->lowerbound_ <= (long)local_b0) {
                  bVar10 = true;
                  uVar27 = uVar26;
                  if (((long)local_60->upperbound_ < 0) ||
                     (local_b0 <= (RepeatedField<long> *)local_60->upperbound_)) goto LAB_0028a96e;
                }
                std::operator+(&local_d0,"Description of image feature \'",(desc->name_).ptr_);
                puVar12 = (undefined8 *)std::__cxx11::string::append((char *)&local_d0);
                local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
                puVar23 = puVar12 + 2;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*puVar12 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)puVar23) {
                  local_f0.field_2._M_allocated_capacity = *puVar23;
                  local_f0.field_2._8_8_ = puVar12[3];
                }
                else {
                  local_f0.field_2._M_allocated_capacity = *puVar23;
                  local_f0._M_dataplus._M_p = (pointer)*puVar12;
                }
                local_f0._M_string_length = puVar12[1];
                *puVar12 = puVar23;
                puVar12[1] = 0;
                *(undefined1 *)(puVar12 + 2) = 0;
                std::__cxx11::to_string(&local_a8,(long)local_b0);
                std::operator+(&local_110,&local_f0,&local_a8);
                puVar12 = (undefined8 *)std::__cxx11::string::append((char *)&local_110);
                local_138 = (undefined1  [8])local_128;
                puVar23 = puVar12 + 2;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*puVar12 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)puVar23) {
                  local_128._0_8_ = *puVar23;
                  local_128._8_8_ = puVar12[3];
                }
                else {
                  local_128._0_8_ = *puVar23;
                  local_138 = (undefined1  [8])*puVar12;
                }
                local_130._M_p = (pointer)puVar12[1];
                *puVar12 = puVar23;
                puVar12[1] = 0;
                *(undefined1 *)(puVar12 + 2) = 0;
                Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,(string *)local_138);
              }
              if (local_138 != (undefined1  [8])local_128) {
                operator_delete((void *)local_138,(ulong)(local_128._0_8_ + 1));
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_110._M_dataplus._M_p != &local_110.field_2) {
                operator_delete(local_110._M_dataplus._M_p,
                                (ulong)(local_110.field_2._M_allocated_capacity + 1));
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
                operator_delete(local_a8._M_dataplus._M_p,
                                (ulong)(local_a8.field_2._M_allocated_capacity + 1));
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
                operator_delete(local_f0._M_dataplus._M_p,
                                (ulong)(local_f0.field_2._M_allocated_capacity + 1));
              }
              modelVersion = (int)local_88;
              uVar30 = local_d0.field_2._M_allocated_capacity;
              _Var32._M_p = local_d0._M_dataplus._M_p;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_d0._M_dataplus._M_p != &local_d0.field_2) goto LAB_0028a964;
              goto LAB_0028a96c;
            }
            local_b0 = (RepeatedField<long> *)local_60->lowerbound_;
            bVar10 = true;
          }
          else {
            std::operator+(&local_f0,"Description of image feature \'",(desc->name_).ptr_);
            puVar12 = (undefined8 *)std::__cxx11::string::append((char *)&local_f0);
            local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
            puVar23 = puVar12 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar12 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar23) {
              local_110.field_2._M_allocated_capacity = *puVar23;
              local_110.field_2._8_8_ = puVar12[3];
            }
            else {
              local_110.field_2._M_allocated_capacity = *puVar23;
              local_110._M_dataplus._M_p = (pointer)*puVar12;
            }
            local_110._M_string_length = puVar12[1];
            *puVar12 = puVar23;
            puVar12[1] = 0;
            *(undefined1 *)(puVar12 + 2) = 0;
            psVar18 = Result::message_abi_cxx11_((Result *)local_160);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_138,&local_110,psVar18);
            Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,(string *)local_138);
LAB_0028a911:
            if (local_138 != (undefined1  [8])local_128) {
              operator_delete((void *)local_138,(ulong)(local_128._0_8_ + 1));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_110._M_dataplus._M_p != &local_110.field_2) {
              operator_delete(local_110._M_dataplus._M_p,
                              (ulong)(local_110.field_2._M_allocated_capacity + 1));
            }
            modelVersion = (int)local_88;
            uVar30 = local_f0.field_2._M_allocated_capacity;
            _Var32._M_p = local_f0._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
LAB_0028a964:
              operator_delete(_Var32._M_p,(ulong)(uVar30 + 1));
            }
LAB_0028a96c:
            bVar10 = false;
            uVar27 = uVar26;
          }
LAB_0028a96e:
          if (local_158._M_p != local_150 + 8) {
            operator_delete(local_158._M_p,(ulong)(local_150._8_8_ + 1));
          }
          pRVar33 = local_b0;
          uVar26 = uVar27;
          if (!bVar10) {
            return __return_storage_ptr__;
          }
        }
        else if (pIVar16->_oneof_case_[0] == 0x15) {
          pIVar21 = (pIVar16->SizeFlexibility_).enumeratedsizes_;
          lVar13 = (long)(pIVar21->sizes_).super_RepeatedPtrFieldBase.current_size_;
          if (lVar13 == 0) {
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_138,"Description of image feature \'",(desc->name_).ptr_);
            puVar12 = (undefined8 *)std::__cxx11::string::append((char *)local_138);
            local_160 = (undefined1  [8])local_150;
            puVar23 = puVar12 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar12 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar23) {
              local_150._0_8_ = *puVar23;
              local_150._8_8_ = puVar12[3];
            }
            else {
              local_150._0_8_ = *puVar23;
              local_160 = (undefined1  [8])*puVar12;
            }
            local_158._M_p = (pointer)puVar12[1];
            *puVar12 = puVar23;
            puVar12[1] = 0;
            *(undefined1 *)(puVar12 + 2) = 0;
            Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,(string *)local_160);
            break;
          }
          if (0 < (long)uVar26 && 0 < (long)pRVar33) {
            pRVar7 = (pIVar21->sizes_).super_RepeatedPtrFieldBase.rep_;
            ppvVar25 = pRVar7->elements;
            if (pRVar7 == (Rep *)0x0) {
              ppvVar25 = (void **)0x0;
            }
            lVar24 = 0;
            do {
              if ((uVar26 == *(ulong *)(*(long *)((long)ppvVar25 + lVar24) + 0x10)) &&
                 (pRVar33 == *(RepeatedField<long> **)(*(long *)((long)ppvVar25 + lVar24) + 0x18)))
              goto LAB_0028948a;
              lVar24 = lVar24 + 8;
            } while (lVar13 * 8 != lVar24);
            std::operator+(&local_a8,"Description of image feature \'",(desc->name_).ptr_);
            puVar12 = (undefined8 *)std::__cxx11::string::append((char *)&local_a8);
            local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
            puVar23 = puVar12 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar12 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar23) {
              local_d0.field_2._M_allocated_capacity = *puVar23;
              local_d0.field_2._8_8_ = puVar12[3];
            }
            else {
              local_d0.field_2._M_allocated_capacity = *puVar23;
              local_d0._M_dataplus._M_p = (pointer)*puVar12;
            }
            local_d0._M_string_length = puVar12[1];
            *puVar12 = puVar23;
            puVar12[1] = 0;
            *(undefined1 *)(puVar12 + 2) = 0;
            std::__cxx11::to_string(&local_80,uVar26);
            std::operator+(&local_f0,&local_d0,&local_80);
            puVar12 = (undefined8 *)std::__cxx11::string::append((char *)&local_f0);
            local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
            puVar23 = puVar12 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar12 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar23) {
              local_110.field_2._M_allocated_capacity = *puVar23;
              local_110.field_2._8_8_ = puVar12[3];
            }
            else {
              local_110.field_2._M_allocated_capacity = *puVar23;
              local_110._M_dataplus._M_p = (pointer)*puVar12;
            }
            local_110._M_string_length = puVar12[1];
            *puVar12 = puVar23;
            puVar12[1] = 0;
            *(undefined1 *)(puVar12 + 2) = 0;
            std::__cxx11::to_string(&local_58,(long)pRVar33);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_138,&local_110,&local_58);
            puVar12 = (undefined8 *)std::__cxx11::string::append(local_138);
            local_160 = (undefined1  [8])local_150;
            puVar23 = puVar12 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar12 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar23) {
              local_150._0_8_ = *puVar23;
              local_150._8_8_ = puVar12[3];
            }
            else {
              local_150._0_8_ = *puVar23;
              local_160 = (undefined1  [8])*puVar12;
            }
            local_158._M_p = (pointer)puVar12[1];
            *puVar12 = puVar23;
            puVar12[1] = 0;
            *(undefined1 *)(puVar12 + 2) = 0;
            Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,(string *)local_160);
            goto LAB_0028b0b5;
          }
          pTVar19 = google::protobuf::internal::RepeatedPtrFieldBase::
                    Get<google::protobuf::RepeatedPtrField<CoreML::Specification::ImageFeatureType_ImageSize>::TypeHandler>
                              (&(pIVar21->sizes_).super_RepeatedPtrFieldBase,0);
          uVar26 = pTVar19->width_;
          if (pFVar6->_oneof_case_[0] == 4) {
            pIVar16 = (pFVar6->Type_).imagetype_;
          }
          else {
            pIVar16 = Specification::ImageFeatureType::default_instance();
          }
          if (pIVar16->_oneof_case_[0] == 0x15) {
            pIVar21 = (pIVar16->SizeFlexibility_).enumeratedsizes_;
          }
          else {
            pIVar21 = Specification::ImageFeatureType_EnumeratedImageSizes::default_instance();
          }
          pTVar19 = google::protobuf::internal::RepeatedPtrFieldBase::
                    Get<google::protobuf::RepeatedPtrField<CoreML::Specification::ImageFeatureType_ImageSize>::TypeHandler>
                              (&(pIVar21->sizes_).super_RepeatedPtrFieldBase,0);
          pRVar33 = (RepeatedField<long> *)pTVar19->height_;
        }
      }
LAB_0028948a:
      if ((long)uVar26 < 1) {
        std::operator+(&local_f0,"Description of image feature \'",(desc->name_).ptr_);
        puVar12 = (undefined8 *)std::__cxx11::string::append((char *)&local_f0);
        local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
        puVar23 = puVar12 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar12 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar23) {
          local_110.field_2._M_allocated_capacity = *puVar23;
          local_110.field_2._8_8_ = puVar12[3];
        }
        else {
          local_110.field_2._M_allocated_capacity = *puVar23;
          local_110._M_dataplus._M_p = (pointer)*puVar12;
        }
        local_110._M_string_length = puVar12[1];
        *puVar12 = puVar23;
        puVar12[1] = 0;
        *(undefined1 *)(puVar12 + 2) = 0;
        if (pFVar6->_oneof_case_[0] == 4) {
          pIVar16 = (pFVar6->Type_).imagetype_;
        }
        else {
          pIVar16 = Specification::ImageFeatureType::default_instance();
        }
        std::__cxx11::to_string(&local_d0,pIVar16->width_);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_138,&local_110,&local_d0);
        puVar12 = (undefined8 *)std::__cxx11::string::append(local_138);
        local_160 = (undefined1  [8])local_150;
        puVar23 = puVar12 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar12 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar23) {
          local_150._0_8_ = *puVar23;
          local_150._8_8_ = puVar12[3];
        }
        else {
          local_150._0_8_ = *puVar23;
          local_160 = (undefined1  [8])*puVar12;
        }
        local_158._M_p = (pointer)puVar12[1];
        *puVar12 = puVar23;
        puVar12[1] = 0;
        *(undefined1 *)(puVar12 + 2) = 0;
        Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,(string *)local_160);
      }
      else {
        if (0 < (long)pRVar33) {
          if (pFVar6->_oneof_case_[0] == 4) {
            pIVar16 = (pFVar6->Type_).imagetype_;
          }
          else {
            pIVar16 = Specification::ImageFeatureType::default_instance();
          }
          iVar11 = pIVar16->colorspace_;
          if (iVar11 < 0x1e) {
            if ((iVar11 == 10) || (iVar11 == 0x14)) {
switchD_00288fd2_caseD_1:
              Result::Result(__return_storage_ptr__);
              return __return_storage_ptr__;
            }
          }
          else {
            if (iVar11 == 0x1e) goto switchD_00288fd2_caseD_1;
            if (iVar11 == 0x28) {
              if (6 < modelVersion) goto switchD_00288fd2_caseD_1;
              std::__cxx11::to_string(&local_110,7);
              puVar12 = (undefined8 *)std::__cxx11::string::append((char *)&local_110);
              local_138 = (undefined1  [8])local_128;
              puVar23 = puVar12 + 2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar12 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)puVar23) {
                local_128._0_8_ = *puVar23;
                local_128._8_8_ = puVar12[3];
              }
              else {
                local_128._0_8_ = *puVar23;
                local_138 = (undefined1  [8])*puVar12;
              }
              local_130._M_p = (pointer)puVar12[1];
              *puVar12 = puVar23;
              puVar12[1] = 0;
              *(undefined1 *)(puVar12 + 2) = 0;
              std::__cxx11::to_string(&local_f0,modelVersion);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_160,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_138,&local_f0);
              std::operator+(&local_a8,"Description of image feature \'",(desc->name_).ptr_);
              puVar12 = (undefined8 *)std::__cxx11::string::append((char *)&local_a8);
              local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
              puVar23 = puVar12 + 2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar12 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)puVar23) {
                local_d0.field_2._M_allocated_capacity = *puVar23;
                local_d0.field_2._8_8_ = puVar12[3];
              }
              else {
                local_d0.field_2._M_allocated_capacity = *puVar23;
                local_d0._M_dataplus._M_p = (pointer)*puVar12;
              }
              local_d0._M_string_length = puVar12[1];
              *puVar12 = puVar23;
              puVar12[1] = 0;
              *(undefined1 *)(puVar12 + 2) = 0;
              psVar18 = (string *)
                        std::__cxx11::string::_M_append((char *)&local_d0,(ulong)local_160);
              Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,psVar18);
              goto LAB_0028b368;
            }
          }
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_138,"Description of image feature \'",(desc->name_).ptr_);
          puVar12 = (undefined8 *)std::__cxx11::string::append((char *)local_138);
          local_160 = (undefined1  [8])local_150;
          puVar23 = puVar12 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar12 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar23) {
            local_150._0_8_ = *puVar23;
            local_150._8_8_ = puVar12[3];
          }
          else {
            local_150._0_8_ = *puVar23;
            local_160 = (undefined1  [8])*puVar12;
          }
          local_158._M_p = (pointer)puVar12[1];
          *puVar12 = puVar23;
          puVar12[1] = 0;
          *(undefined1 *)(puVar12 + 2) = 0;
          Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,(string *)local_160);
          break;
        }
        std::operator+(&local_f0,"Description of image feature \'",(desc->name_).ptr_);
        puVar12 = (undefined8 *)std::__cxx11::string::append((char *)&local_f0);
        local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
        puVar23 = puVar12 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar12 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar23) {
          local_110.field_2._M_allocated_capacity = *puVar23;
          local_110.field_2._8_8_ = puVar12[3];
        }
        else {
          local_110.field_2._M_allocated_capacity = *puVar23;
          local_110._M_dataplus._M_p = (pointer)*puVar12;
        }
        local_110._M_string_length = puVar12[1];
        *puVar12 = puVar23;
        puVar12[1] = 0;
        *(undefined1 *)(puVar12 + 2) = 0;
        if (pFVar6->_oneof_case_[0] == 4) {
          pIVar16 = (pFVar6->Type_).imagetype_;
        }
        else {
          pIVar16 = Specification::ImageFeatureType::default_instance();
        }
        std::__cxx11::to_string(&local_d0,pIVar16->height_);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_138,&local_110,&local_d0);
        puVar12 = (undefined8 *)std::__cxx11::string::append(local_138);
        local_160 = (undefined1  [8])local_150;
        puVar23 = puVar12 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar12 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar23) {
          local_150._0_8_ = *puVar23;
          local_150._8_8_ = puVar12[3];
        }
        else {
          local_150._0_8_ = *puVar23;
          local_160 = (undefined1  [8])*puVar12;
        }
        local_158._M_p = (pointer)puVar12[1];
        *puVar12 = puVar23;
        puVar12[1] = 0;
        *(undefined1 *)(puVar12 + 2) = 0;
        Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,(string *)local_160);
      }
      if (local_160 != (undefined1  [8])local_150) {
        operator_delete((void *)local_160,(ulong)(local_150._0_8_ + 1));
      }
      if (local_138 != (undefined1  [8])local_128) {
        operator_delete((void *)local_138,(ulong)(local_128._0_8_ + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p,
                        (ulong)(local_d0.field_2._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110._M_dataplus._M_p != &local_110.field_2) {
        operator_delete(local_110._M_dataplus._M_p,
                        (ulong)(local_110.field_2._M_allocated_capacity + 1));
      }
      local_a8.field_2._M_allocated_capacity = local_f0.field_2._M_allocated_capacity;
      local_a8._M_dataplus._M_p = local_f0._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p == &local_f0.field_2) {
        return __return_storage_ptr__;
      }
      goto LAB_0028911b;
    case 5:
      pAVar17 = (pFVar6->Type_).multiarraytype_;
      iVar11 = (pAVar17->shape_).current_size_;
      if (2 < modelVersion) {
        local_b0 = &pAVar17->shape_;
        if (pAVar17->_oneof_case_[0] == 0x1f) {
          local_60 = (SizeRange *)CONCAT44(local_60._4_4_,iVar11);
          pAVar8 = (pAVar17->ShapeFlexibility_).enumeratedshapes_;
          iVar11 = (pAVar8->shapes_).super_RepeatedPtrFieldBase.current_size_;
          this = &pAVar8->shapes_;
          local_88 = uVar27;
          if (0 < iVar11) {
            uVar28 = 0;
            do {
              pTVar15 = google::protobuf::internal::RepeatedPtrFieldBase::
                        Get<google::protobuf::RepeatedPtrField<CoreML::Specification::SizeRange>::TypeHandler>
                                  (&this->super_RepeatedPtrFieldBase,uVar28);
              validateSizeRange((Result *)local_160,pTVar15);
              bVar10 = Result::good((Result *)local_160);
              if (!bVar10) {
                std::operator+(&local_a8,"Description of multiarray feature \'",(desc->name_).ptr_);
                puVar12 = (undefined8 *)std::__cxx11::string::append((char *)&local_a8);
                paVar2 = &local_d0.field_2;
                paVar3 = &local_80.field_2;
                puVar23 = puVar12 + 2;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*puVar12 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)puVar23) {
                  local_d0.field_2._M_allocated_capacity = *puVar23;
                  local_d0.field_2._8_8_ = puVar12[3];
                  local_d0._M_dataplus._M_p = (pointer)paVar2;
                }
                else {
                  local_d0.field_2._M_allocated_capacity = *puVar23;
                  local_d0._M_dataplus._M_p = (pointer)*puVar12;
                }
                local_d0._M_string_length = puVar12[1];
                *puVar12 = puVar23;
                puVar12[1] = 0;
                *(undefined1 *)(puVar12 + 2) = 0;
                uVar34 = 1;
                if (uVar28 < 10) goto LAB_0028b486;
                uVar9 = 4;
                uVar22 = uVar28;
                goto LAB_0028a878;
              }
              if (local_158._M_p != local_150 + 8) {
                operator_delete(local_158._M_p,(ulong)(local_150._8_8_ + 1));
              }
              uVar28 = uVar28 + 1;
              iVar11 = (pAVar8->shapes_).super_RepeatedPtrFieldBase.current_size_;
            } while ((int)uVar28 < iVar11);
          }
          if ((int)local_60 != 0) {
            if (local_b0->current_size_ != iVar11) {
              std::operator+(&local_a8,"Description of multiarray feature \'",(desc->name_).ptr_);
              puVar12 = (undefined8 *)std::__cxx11::string::append((char *)&local_a8);
              local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
              puVar23 = puVar12 + 2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar12 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)puVar23) {
                local_d0.field_2._M_allocated_capacity = *puVar23;
                local_d0.field_2._8_8_ = puVar12[3];
              }
              else {
                local_d0.field_2._M_allocated_capacity = *puVar23;
                local_d0._M_dataplus._M_p = (pointer)*puVar12;
              }
              local_d0._M_string_length = puVar12[1];
              *puVar12 = puVar23;
              puVar12[1] = 0;
              *(undefined1 *)(puVar12 + 2) = 0;
              std::__cxx11::to_string(&local_80,local_b0->current_size_);
              std::operator+(&local_f0,&local_d0,&local_80);
              puVar12 = (undefined8 *)std::__cxx11::string::append((char *)&local_f0);
              local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
              puVar23 = puVar12 + 2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar12 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)puVar23) {
                local_110.field_2._M_allocated_capacity = *puVar23;
                local_110.field_2._8_8_ = puVar12[3];
              }
              else {
                local_110.field_2._M_allocated_capacity = *puVar23;
                local_110._M_dataplus._M_p = (pointer)*puVar12;
              }
              local_110._M_string_length = puVar12[1];
              *puVar12 = puVar23;
              puVar12[1] = 0;
              *(undefined1 *)(puVar12 + 2) = 0;
              std::__cxx11::to_string
                        (&local_58,(pAVar8->shapes_).super_RepeatedPtrFieldBase.current_size_);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_138,&local_110,&local_58);
              puVar12 = (undefined8 *)std::__cxx11::string::append(local_138);
              local_160 = (undefined1  [8])local_150;
              puVar23 = puVar12 + 2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar12 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)puVar23) {
                local_150._0_8_ = *puVar23;
                local_150._8_8_ = puVar12[3];
              }
              else {
                local_150._0_8_ = *puVar23;
                local_160 = (undefined1  [8])*puVar12;
              }
              local_158._M_p = (pointer)puVar12[1];
              *puVar12 = puVar23;
              puVar12[1] = 0;
              *(undefined1 *)(puVar12 + 2) = 0;
              Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,(string *)local_160);
LAB_0028b0b5:
              if (local_160 != (undefined1  [8])local_150) {
                operator_delete((void *)local_160,(ulong)(local_150._0_8_ + 1));
              }
              if (local_138 != (undefined1  [8])local_128) {
                operator_delete((void *)local_138,(ulong)(local_128._0_8_ + 1));
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_58._M_dataplus._M_p != &local_58.field_2) {
                operator_delete(local_58._M_dataplus._M_p,
                                (ulong)(local_58.field_2._M_allocated_capacity + 1));
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_110._M_dataplus._M_p != &local_110.field_2) {
                operator_delete(local_110._M_dataplus._M_p,
                                (ulong)(local_110.field_2._M_allocated_capacity + 1));
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
                operator_delete(local_f0._M_dataplus._M_p,
                                (ulong)(local_f0.field_2._M_allocated_capacity + 1));
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_80._M_dataplus._M_p != &local_80.field_2) {
                operator_delete(local_80._M_dataplus._M_p,
                                (ulong)(local_80.field_2._M_allocated_capacity + 1));
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
                operator_delete(local_d0._M_dataplus._M_p,
                                (ulong)(local_d0.field_2._M_allocated_capacity + 1));
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_a8._M_dataplus._M_p == &local_a8.field_2) {
                return __return_storage_ptr__;
              }
              goto LAB_0028911b;
            }
            if (0 < iVar11) {
              iVar11 = 0;
              do {
                plVar14 = google::protobuf::RepeatedField<long>::Get(local_b0,iVar11);
                lVar13 = *plVar14;
                pTVar15 = google::protobuf::internal::RepeatedPtrFieldBase::
                          Get<google::protobuf::RepeatedPtrField<CoreML::Specification::SizeRange>::TypeHandler>
                                    (&this->super_RepeatedPtrFieldBase,iVar11);
                if (lVar13 < (int)pTVar15->lowerbound_) {
LAB_0028ade5:
                  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_138,"Description of multiarray feature \'",
                                 (desc->name_).ptr_);
                  puVar12 = (undefined8 *)std::__cxx11::string::append((char *)local_138);
                  local_160 = (undefined1  [8])local_150;
                  puVar23 = puVar12 + 2;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*puVar12 ==
                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)puVar23) {
                    local_150._0_8_ = *puVar23;
                    local_150._8_8_ = puVar12[3];
                  }
                  else {
                    local_150._0_8_ = *puVar23;
                    local_160 = (undefined1  [8])*puVar12;
                  }
                  local_158._M_p = (pointer)puVar12[1];
                  *puVar12 = puVar23;
                  puVar12[1] = 0;
                  *(undefined1 *)(puVar12 + 2) = 0;
                  Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,(string *)local_160)
                  ;
                  goto LAB_002890f1;
                }
                pTVar15 = google::protobuf::internal::RepeatedPtrFieldBase::
                          Get<google::protobuf::RepeatedPtrField<CoreML::Specification::SizeRange>::TypeHandler>
                                    (&this->super_RepeatedPtrFieldBase,iVar11);
                if (-1 < pTVar15->upperbound_) {
                  plVar14 = google::protobuf::RepeatedField<long>::Get(local_b0,iVar11);
                  lVar13 = *plVar14;
                  pTVar15 = google::protobuf::internal::RepeatedPtrFieldBase::
                            Get<google::protobuf::RepeatedPtrField<CoreML::Specification::SizeRange>::TypeHandler>
                                      (&this->super_RepeatedPtrFieldBase,iVar11);
                  if (pTVar15->upperbound_ < lVar13) goto LAB_0028ade5;
                }
                iVar11 = iVar11 + 1;
              } while (iVar11 < (pAVar8->shapes_).super_RepeatedPtrFieldBase.current_size_);
              goto LAB_0028986c;
            }
            goto LAB_00289876;
          }
LAB_002898bd:
          if (pFVar6->_oneof_case_[0] == 5) {
            pAVar17 = (pFVar6->Type_).multiarraytype_;
          }
          else {
            pAVar17 = Specification::ArrayFeatureType::default_instance();
          }
          iVar11 = pAVar17->datatype_;
          if (0x1003f < iVar11) {
            if ((iVar11 != 0x10040) && (iVar11 != 0x20020)) {
LAB_00289965:
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_138,"Description of multiarray feature \'",(desc->name_).ptr_);
              puVar12 = (undefined8 *)std::__cxx11::string::append((char *)local_138);
              local_160 = (undefined1  [8])local_150;
              puVar23 = puVar12 + 2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar12 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)puVar23) {
                local_150._0_8_ = *puVar23;
                local_150._8_8_ = puVar12[3];
              }
              else {
                local_150._0_8_ = *puVar23;
                local_160 = (undefined1  [8])*puVar12;
              }
              local_158._M_p = (pointer)puVar12[1];
              *puVar12 = puVar23;
              puVar12[1] = 0;
              *(undefined1 *)(puVar12 + 2) = 0;
              Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,(string *)local_160);
              break;
            }
LAB_00289f01:
            if (pFVar6->_oneof_case_[0] == 5) {
              pAVar17 = (pFVar6->Type_).multiarraytype_;
            }
            else {
              pAVar17 = Specification::ArrayFeatureType::default_instance();
            }
            uVar5 = pAVar17->_oneof_case_[1];
            if (uVar5 == 0x29) {
              if (pFVar6->_oneof_case_[0] == 5) {
                pAVar17 = (pFVar6->Type_).multiarraytype_;
              }
              else {
                pAVar17 = Specification::ArrayFeatureType::default_instance();
              }
              if (pAVar17->datatype_ == 0x20020) goto switchD_00288fd2_caseD_1;
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_138,"Description of multiarray feature \'",(desc->name_).ptr_);
              puVar12 = (undefined8 *)std::__cxx11::string::append((char *)local_138);
              local_160 = (undefined1  [8])local_150;
              puVar23 = puVar12 + 2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar12 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)puVar23) {
                local_150._0_8_ = *puVar23;
                local_150._8_8_ = puVar12[3];
              }
              else {
                local_150._0_8_ = *puVar23;
                local_160 = (undefined1  [8])*puVar12;
              }
              local_158._M_p = (pointer)puVar12[1];
              *puVar12 = puVar23;
              puVar12[1] = 0;
              *(undefined1 *)(puVar12 + 2) = 0;
              Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,(string *)local_160);
            }
            else if (uVar5 == 0x33) {
              if (pFVar6->_oneof_case_[0] == 5) {
                pAVar17 = (pFVar6->Type_).multiarraytype_;
              }
              else {
                pAVar17 = Specification::ArrayFeatureType::default_instance();
              }
              if (pAVar17->datatype_ == 0x10020) goto switchD_00288fd2_caseD_1;
              if (pFVar6->_oneof_case_[0] == 5) {
                pAVar17 = (pFVar6->Type_).multiarraytype_;
              }
              else {
                pAVar17 = Specification::ArrayFeatureType::default_instance();
              }
              if (pAVar17->datatype_ == 0x10010) goto switchD_00288fd2_caseD_1;
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_138,"Description of multiarray feature \'",(desc->name_).ptr_);
              puVar12 = (undefined8 *)std::__cxx11::string::append((char *)local_138);
              local_160 = (undefined1  [8])local_150;
              puVar23 = puVar12 + 2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar12 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)puVar23) {
                local_150._0_8_ = *puVar23;
                local_150._8_8_ = puVar12[3];
              }
              else {
                local_150._0_8_ = *puVar23;
                local_160 = (undefined1  [8])*puVar12;
              }
              local_158._M_p = (pointer)puVar12[1];
              *puVar12 = puVar23;
              puVar12[1] = 0;
              *(undefined1 *)(puVar12 + 2) = 0;
              Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,(string *)local_160);
            }
            else {
              if (uVar5 != 0x3d) goto switchD_00288fd2_caseD_1;
              if (pFVar6->_oneof_case_[0] == 5) {
                pAVar17 = (pFVar6->Type_).multiarraytype_;
              }
              else {
                pAVar17 = Specification::ArrayFeatureType::default_instance();
              }
              if (pAVar17->datatype_ == 0x10040) goto switchD_00288fd2_caseD_1;
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_138,"Description of multiarray feature \'",(desc->name_).ptr_);
              puVar12 = (undefined8 *)std::__cxx11::string::append((char *)local_138);
              local_160 = (undefined1  [8])local_150;
              puVar23 = puVar12 + 2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar12 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)puVar23) {
                local_150._0_8_ = *puVar23;
                local_150._8_8_ = puVar12[3];
              }
              else {
                local_150._0_8_ = *puVar23;
                local_160 = (undefined1  [8])*puVar12;
              }
              local_158._M_p = (pointer)puVar12[1];
              *puVar12 = puVar23;
              puVar12[1] = 0;
              *(undefined1 *)(puVar12 + 2) = 0;
              Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,(string *)local_160);
            }
            break;
          }
          if (iVar11 != 0x10010) {
            if (iVar11 != 0x10020) goto LAB_00289965;
            goto LAB_00289f01;
          }
          iVar11 = (int)local_88;
          if (6 < iVar11) goto LAB_00289f01;
          std::__cxx11::to_string(&local_110,7);
          puVar12 = (undefined8 *)std::__cxx11::string::append((char *)&local_110);
          local_138 = (undefined1  [8])local_128;
          puVar23 = puVar12 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar12 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar23) {
            local_128._0_8_ = *puVar23;
            local_128._8_8_ = puVar12[3];
          }
          else {
            local_128._0_8_ = *puVar23;
            local_138 = (undefined1  [8])*puVar12;
          }
          local_130._M_p = (pointer)puVar12[1];
          *puVar12 = puVar23;
          puVar12[1] = 0;
          *(undefined1 *)(puVar12 + 2) = 0;
          std::__cxx11::to_string(&local_f0,iVar11);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_160,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_138,&local_f0);
          std::operator+(&local_a8,"Description of multiarray feature \'",(desc->name_).ptr_);
          puVar12 = (undefined8 *)std::__cxx11::string::append((char *)&local_a8);
          local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
          puVar23 = puVar12 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar12 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar23) {
            local_d0.field_2._M_allocated_capacity = *puVar23;
            local_d0.field_2._8_8_ = puVar12[3];
          }
          else {
            local_d0.field_2._M_allocated_capacity = *puVar23;
            local_d0._M_dataplus._M_p = (pointer)*puVar12;
          }
          local_d0._M_string_length = puVar12[1];
          *puVar12 = puVar23;
          puVar12[1] = 0;
          *(undefined1 *)(puVar12 + 2) = 0;
          psVar18 = (string *)std::__cxx11::string::_M_append((char *)&local_d0,(ulong)local_160);
          Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,psVar18);
LAB_0028b368:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
            operator_delete(local_d0._M_dataplus._M_p,
                            (ulong)(local_d0.field_2._M_allocated_capacity + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
            operator_delete(local_a8._M_dataplus._M_p,
                            (ulong)(local_a8.field_2._M_allocated_capacity + 1));
          }
          if (local_160 != (undefined1  [8])local_150) {
            operator_delete((void *)local_160,(ulong)(local_150._0_8_ + 1));
          }
          uVar30 = local_f0.field_2._M_allocated_capacity;
          _Var32._M_p = local_f0._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
LAB_0028b3da:
            operator_delete(_Var32._M_p,(ulong)(uVar30 + 1));
          }
        }
        else {
          if (pAVar17->_oneof_case_[0] != 0x15) goto LAB_00289410;
          lVar13 = (long)(((pAVar17->ShapeFlexibility_).enumeratedshapes_)->shapes_).
                         super_RepeatedPtrFieldBase.current_size_;
          if (lVar13 == 0) {
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_138,"Description of multiarray feature \'",(desc->name_).ptr_);
            puVar12 = (undefined8 *)std::__cxx11::string::append((char *)local_138);
            local_160 = (undefined1  [8])local_150;
            puVar23 = puVar12 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar12 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar23) {
              local_150._0_8_ = *puVar23;
              local_150._8_8_ = puVar12[3];
            }
            else {
              local_150._0_8_ = *puVar23;
              local_160 = (undefined1  [8])*puVar12;
            }
            local_158._M_p = (pointer)puVar12[1];
            *puVar12 = puVar23;
            puVar12[1] = 0;
            *(undefined1 *)(puVar12 + 2) = 0;
            Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,(string *)local_160);
            break;
          }
          pRVar7 = (((pAVar17->ShapeFlexibility_).enumeratedshapes_)->shapes_).
                   super_RepeatedPtrFieldBase.rep_;
          ppvVar25 = pRVar7->elements;
          if (pRVar7 == (Rep *)0x0) {
            ppvVar25 = (void **)0x0;
          }
          local_38 = ppvVar25 + lVar13;
          lVar24 = 0;
          do {
            if (*(int *)(*(long *)((long)ppvVar25 + lVar24) + 0x10) == 0) {
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_138,"Description of multiarray feature \'",(desc->name_).ptr_);
              puVar12 = (undefined8 *)std::__cxx11::string::append((char *)local_138);
              local_160 = (undefined1  [8])local_150;
              puVar23 = puVar12 + 2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar12 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)puVar23) {
                local_150._0_8_ = *puVar23;
                local_150._8_8_ = puVar12[3];
              }
              else {
                local_150._0_8_ = *puVar23;
                local_160 = (undefined1  [8])*puVar12;
              }
              local_158._M_p = (pointer)puVar12[1];
              *puVar12 = puVar23;
              puVar12[1] = 0;
              *(undefined1 *)(puVar12 + 2) = 0;
              Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,(string *)local_160);
              goto LAB_002890f1;
            }
            lVar24 = lVar24 + 8;
          } while (lVar13 * 8 != lVar24);
          local_60 = (SizeRange *)CONCAT44(local_60._4_4_,iVar11);
          local_88 = uVar27;
          if (iVar11 == 0) goto LAB_002898bd;
          do {
            iVar11 = *(int *)((long)*ppvVar25 + 0x10);
            if (iVar11 == local_b0->current_size_) {
              if (iVar11 < 1) goto LAB_0028986c;
              pRVar33 = (RepeatedField<long> *)((long)*ppvVar25 + 0x10);
              iVar11 = 0;
              while( true ) {
                plVar14 = google::protobuf::RepeatedField<long>::Get(local_b0,iVar11);
                lVar13 = *plVar14;
                plVar14 = google::protobuf::RepeatedField<long>::Get(pRVar33,iVar11);
                if (lVar13 != *plVar14) break;
                iVar11 = iVar11 + 1;
                if (pRVar33->current_size_ <= iVar11) goto LAB_0028986c;
              }
            }
            ppvVar25 = ppvVar25 + 1;
          } while (ppvVar25 != local_38);
          std::operator+(&local_110,"Description of multiarray feature \'",(desc->name_).ptr_);
          puVar12 = (undefined8 *)std::__cxx11::string::append((char *)&local_110);
          local_138 = (undefined1  [8])local_128;
          puVar23 = puVar12 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar12 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar23) {
            local_128._0_8_ = *puVar23;
            local_128._8_8_ = puVar12[3];
          }
          else {
            local_128._0_8_ = *puVar23;
            local_138 = (undefined1  [8])*puVar12;
          }
          local_130._M_p = (pointer)puVar12[1];
          *puVar12 = puVar23;
          puVar12[1] = 0;
          *(undefined1 *)(puVar12 + 2) = 0;
          puVar12 = (undefined8 *)std::__cxx11::string::append(local_138);
          puVar23 = puVar12 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar12 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar23) {
            local_150._0_8_ = *puVar23;
            local_150._8_8_ = puVar12[3];
            local_160 = (undefined1  [8])local_150;
          }
          else {
            local_150._0_8_ = *puVar23;
            local_160 = (undefined1  [8])*puVar12;
          }
          local_158._M_p = (pointer)puVar12[1];
          *puVar12 = puVar23;
          puVar12[1] = 0;
          *(undefined1 *)(puVar12 + 2) = 0;
          Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,(string *)local_160);
          uVar30 = local_150._0_8_;
          _Var32._M_p = (pointer)local_160;
          if (local_160 != (undefined1  [8])local_150) goto LAB_0028b3da;
        }
        if (local_138 != (undefined1  [8])local_128) {
          operator_delete((void *)local_138,(ulong)(local_128._0_8_ + 1));
        }
        local_a8.field_2._M_allocated_capacity = local_110.field_2._M_allocated_capacity;
        local_a8._M_dataplus._M_p = local_110._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_110._M_dataplus._M_p == &local_110.field_2) {
          return __return_storage_ptr__;
        }
        goto LAB_0028911b;
      }
LAB_00289410:
      local_60 = (SizeRange *)CONCAT44(local_60._4_4_,iVar11);
      local_88 = uVar27;
      if (isInput && iVar11 == 0) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_138,"Description of multiarray feature \'",(desc->name_).ptr_);
        puVar12 = (undefined8 *)std::__cxx11::string::append((char *)local_138);
        local_160 = (undefined1  [8])local_150;
        puVar23 = puVar12 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar12 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar23) {
          local_150._0_8_ = *puVar23;
          local_150._8_8_ = puVar12[3];
        }
        else {
          local_150._0_8_ = *puVar23;
          local_160 = (undefined1  [8])*puVar12;
        }
        local_158._M_p = (pointer)puVar12[1];
        *puVar12 = puVar23;
        puVar12[1] = 0;
        *(undefined1 *)(puVar12 + 2) = 0;
        Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,(string *)local_160);
        break;
      }
LAB_0028986c:
      if ((int)local_60 == 0) goto LAB_002898bd;
LAB_00289876:
      uVar28 = 0;
      while( true ) {
        if (pFVar6->_oneof_case_[0] == 5) {
          pAVar17 = (ArrayFeatureType *)(pFVar6->Type_).int64type_;
        }
        else {
          pAVar17 = Specification::ArrayFeatureType::default_instance();
        }
        if ((pAVar17->shape_).current_size_ <= (int)uVar28) goto LAB_002898bd;
        if (pFVar6->_oneof_case_[0] == 5) {
          pAVar17 = (pFVar6->Type_).multiarraytype_;
        }
        else {
          pAVar17 = Specification::ArrayFeatureType::default_instance();
        }
        plVar14 = google::protobuf::RepeatedField<long>::Get(&pAVar17->shape_,uVar28);
        lVar13 = *plVar14;
        if (lVar13 < 0) break;
        uVar28 = uVar28 + 1;
      }
      std::operator+(&local_a8,"Description of multiarray feature \'",(desc->name_).ptr_);
      puVar12 = (undefined8 *)std::__cxx11::string::append((char *)&local_a8);
      paVar2 = &local_d0.field_2;
      puVar23 = puVar12 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar12 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar23) {
        local_d0.field_2._M_allocated_capacity = *puVar23;
        local_d0.field_2._8_8_ = puVar12[3];
        local_d0._M_dataplus._M_p = (pointer)paVar2;
      }
      else {
        local_d0.field_2._M_allocated_capacity = *puVar23;
        local_d0._M_dataplus._M_p = (pointer)*puVar12;
      }
      local_d0._M_string_length = puVar12[1];
      *puVar12 = puVar23;
      puVar12[1] = 0;
      *(undefined1 *)(puVar12 + 2) = 0;
      uVar34 = 1;
      if (9 < uVar28) {
        uVar27 = (ulong)uVar28;
        uVar9 = 4;
        do {
          uVar34 = uVar9;
          uVar22 = (uint)uVar27;
          if (uVar22 < 100) {
            uVar34 = uVar34 - 2;
            goto LAB_0028a9a2;
          }
          if (uVar22 < 1000) {
            uVar34 = uVar34 - 1;
            goto LAB_0028a9a2;
          }
          if (uVar22 < 10000) goto LAB_0028a9a2;
          uVar27 = uVar27 / 10000;
          uVar9 = uVar34 + 4;
        } while (99999 < uVar22);
        uVar34 = uVar34 + 1;
      }
LAB_0028a9a2:
      paVar3 = &local_80.field_2;
      local_80._M_dataplus._M_p = (pointer)paVar3;
      std::__cxx11::string::_M_construct((ulong)&local_80,(char)uVar34);
      std::__detail::__to_chars_10_impl<unsigned_int>(local_80._M_dataplus._M_p,uVar34,uVar28);
      uVar30 = (undefined1 *)0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != paVar2) {
        uVar30 = local_d0.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar30 < (undefined1 *)(local_80._M_string_length + local_d0._M_string_length)) {
        uVar30 = (undefined1 *)0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80._M_dataplus._M_p != paVar3) {
          uVar30 = local_80.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar30 < (undefined1 *)(local_80._M_string_length + local_d0._M_string_length))
        goto LAB_0028aa27;
        puVar12 = (undefined8 *)
                  std::__cxx11::string::replace
                            ((ulong)&local_80,0,(char *)0x0,(ulong)local_d0._M_dataplus._M_p);
      }
      else {
LAB_0028aa27:
        puVar12 = (undefined8 *)
                  std::__cxx11::string::_M_append
                            ((char *)&local_d0,(ulong)local_80._M_dataplus._M_p);
      }
      local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
      puVar23 = puVar12 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar12 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar23) {
        local_f0.field_2._M_allocated_capacity = *puVar23;
        local_f0.field_2._8_8_ = puVar12[3];
      }
      else {
        local_f0.field_2._M_allocated_capacity = *puVar23;
        local_f0._M_dataplus._M_p = (pointer)*puVar12;
      }
      local_f0._M_string_length = puVar12[1];
      *puVar12 = puVar23;
      puVar12[1] = 0;
      *(undefined1 *)puVar23 = 0;
      puVar12 = (undefined8 *)std::__cxx11::string::append((char *)&local_f0);
      paVar1 = &local_110.field_2;
      puVar23 = puVar12 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar12 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar23) {
        local_110.field_2._M_allocated_capacity = *puVar23;
        local_110.field_2._8_8_ = puVar12[3];
        local_110._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_110.field_2._M_allocated_capacity = *puVar23;
        local_110._M_dataplus._M_p = (pointer)*puVar12;
      }
      local_110._M_string_length = puVar12[1];
      *puVar12 = puVar23;
      puVar12[1] = 0;
      *(undefined1 *)(puVar12 + 2) = 0;
      uVar27 = -lVar13;
      uVar28 = 1;
      if (9 < uVar27) {
        uVar26 = uVar27;
        uVar34 = 4;
        do {
          uVar28 = uVar34;
          if (uVar26 < 100) {
            uVar28 = uVar28 - 2;
            goto LAB_0028ab51;
          }
          if (uVar26 < 1000) {
            uVar28 = uVar28 - 1;
            goto LAB_0028ab51;
          }
          if (uVar26 < 10000) goto LAB_0028ab51;
          bVar10 = 99999 < uVar26;
          uVar26 = uVar26 / 10000;
          uVar34 = uVar28 + 4;
        } while (bVar10);
        uVar28 = uVar28 + 1;
      }
LAB_0028ab51:
      paVar4 = &local_58.field_2;
      local_58._M_dataplus._M_p = (pointer)paVar4;
      std::__cxx11::string::_M_construct((ulong)&local_58,(char)uVar28 + '\x01');
      std::__detail::__to_chars_10_impl<unsigned_long>(local_58._M_dataplus._M_p + 1,uVar28,uVar27);
      uVar30 = (undefined1 *)0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110._M_dataplus._M_p != paVar1) {
        uVar30 = local_110.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar30 < (undefined1 *)(local_58._M_string_length + local_110._M_string_length)) {
        uVar30 = (undefined1 *)0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p != paVar4) {
          uVar30 = local_58.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar30 < (undefined1 *)(local_58._M_string_length + local_110._M_string_length))
        goto LAB_0028abd2;
        puVar12 = (undefined8 *)
                  std::__cxx11::string::replace
                            ((ulong)&local_58,0,(char *)0x0,(ulong)local_110._M_dataplus._M_p);
      }
      else {
LAB_0028abd2:
        puVar12 = (undefined8 *)
                  std::__cxx11::string::_M_append
                            ((char *)&local_110,(ulong)local_58._M_dataplus._M_p);
      }
      local_138 = (undefined1  [8])local_128;
      puVar23 = puVar12 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar12 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar23) {
        local_128._0_8_ = *puVar23;
        local_128._8_8_ = puVar12[3];
      }
      else {
        local_128._0_8_ = *puVar23;
        local_138 = (undefined1  [8])*puVar12;
      }
      local_130._M_p = (pointer)puVar12[1];
      *puVar12 = puVar23;
      puVar12[1] = 0;
      *(undefined1 *)puVar23 = 0;
      puVar12 = (undefined8 *)std::__cxx11::string::append(local_138);
      puVar23 = puVar12 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar12 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar23) {
        local_150._0_8_ = *puVar23;
        local_150._8_8_ = puVar12[3];
        local_160 = (undefined1  [8])local_150;
      }
      else {
        local_150._0_8_ = *puVar23;
        local_160 = (undefined1  [8])*puVar12;
      }
      local_158._M_p = (pointer)puVar12[1];
      *puVar12 = puVar23;
      puVar12[1] = 0;
      *(undefined1 *)(puVar12 + 2) = 0;
      Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,(string *)local_160);
      if (local_160 != (undefined1  [8])local_150) {
        operator_delete((void *)local_160,(ulong)(local_150._0_8_ + 1));
      }
      if (local_138 != (undefined1  [8])local_128) {
        operator_delete((void *)local_138,(ulong)(local_128._0_8_ + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != paVar4) {
        operator_delete(local_58._M_dataplus._M_p,
                        (ulong)(local_58.field_2._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110._M_dataplus._M_p != paVar1) {
        operator_delete(local_110._M_dataplus._M_p,
                        (ulong)(local_110.field_2._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
        operator_delete(local_f0._M_dataplus._M_p,
                        (ulong)(local_f0.field_2._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != paVar3) {
        operator_delete(local_80._M_dataplus._M_p,
                        (ulong)(local_80.field_2._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != paVar2) {
        operator_delete(local_d0._M_dataplus._M_p,
                        (ulong)(local_d0.field_2._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p == &local_a8.field_2) {
        return __return_storage_ptr__;
      }
      goto LAB_0028911b;
    case 6:
      if (*(int *)((long)&(((pFVar6->Type_).multiarraytype_)->shape_).rep_ + 4) != 0)
      goto switchD_00288fd2_caseD_1;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_138,
                     "Description of dictionary feature \'",(desc->name_).ptr_);
      puVar12 = (undefined8 *)std::__cxx11::string::append((char *)local_138);
      local_160 = (undefined1  [8])local_150;
      puVar23 = puVar12 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar12 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar23) {
        local_150._0_8_ = *puVar23;
        local_150._8_8_ = puVar12[3];
      }
      else {
        local_150._0_8_ = *puVar23;
        local_160 = (undefined1  [8])*puVar12;
      }
      local_158._M_p = (pointer)puVar12[1];
      *puVar12 = puVar23;
      puVar12[1] = 0;
      *(undefined1 *)(puVar12 + 2) = 0;
      Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,(string *)local_160);
      break;
    case 7:
      if (modelVersion < 3) {
        local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
        std::__cxx11::string::_M_construct((ulong)&local_f0,'\x01');
        *local_f0._M_dataplus._M_p = '3';
        puVar12 = (undefined8 *)
                  std::__cxx11::string::replace((ulong)&local_f0,0,(char *)0x0,0x347fe3);
        local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
        puVar23 = puVar12 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar12 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar23) {
          local_110.field_2._M_allocated_capacity = *puVar23;
          local_110.field_2._8_8_ = puVar12[3];
        }
        else {
          local_110.field_2._M_allocated_capacity = *puVar23;
          local_110._M_dataplus._M_p = (pointer)*puVar12;
        }
        local_110._M_string_length = puVar12[1];
        *puVar12 = puVar23;
        puVar12[1] = 0;
        *(undefined1 *)(puVar12 + 2) = 0;
        puVar12 = (undefined8 *)std::__cxx11::string::append((char *)&local_110);
        puVar23 = puVar12 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar12 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar23) {
          local_128._0_8_ = *puVar23;
          local_128._8_8_ = puVar12[3];
          local_138 = (undefined1  [8])local_128;
        }
        else {
          local_128._0_8_ = *puVar23;
          local_138 = (undefined1  [8])*puVar12;
        }
        local_130._M_p = (pointer)puVar12[1];
        *puVar12 = puVar23;
        puVar12[1] = 0;
        *(undefined1 *)(puVar12 + 2) = 0;
        uVar28 = -modelVersion;
        if (0 < modelVersion) {
          uVar28 = modelVersion;
        }
        uVar34 = 1;
        if (9 < uVar28) {
          uVar27 = (ulong)uVar28;
          uVar9 = 4;
          do {
            uVar34 = uVar9;
            uVar22 = (uint)uVar27;
            if (uVar22 < 100) {
              uVar34 = uVar34 - 2;
              goto LAB_00289f9b;
            }
            if (uVar22 < 1000) {
              uVar34 = uVar34 - 1;
              goto LAB_00289f9b;
            }
            if (uVar22 < 10000) goto LAB_00289f9b;
            uVar27 = uVar27 / 10000;
            uVar9 = uVar34 + 4;
          } while (99999 < uVar22);
          uVar34 = uVar34 + 1;
        }
LAB_00289f9b:
        paVar2 = &local_d0.field_2;
        local_d0._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct
                  ((ulong)&local_d0,(char)uVar34 - (char)(modelVersion >> 0x1f));
        std::__detail::__to_chars_10_impl<unsigned_int>
                  (local_d0._M_dataplus._M_p + ((uint)modelVersion >> 0x1f),uVar34,uVar28);
        pcVar31 = (pointer)0xf;
        if (local_138 != (undefined1  [8])local_128) {
          pcVar31 = (pointer)local_128._0_8_;
        }
        if (pcVar31 < local_130._M_p + local_d0._M_string_length) {
          uVar30 = (pointer)0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d0._M_dataplus._M_p != paVar2) {
            uVar30 = local_d0.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar30 < local_130._M_p + local_d0._M_string_length) goto LAB_0028a01f;
          puVar12 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)&local_d0,0,(char *)0x0,(ulong)local_138);
        }
        else {
LAB_0028a01f:
          puVar12 = (undefined8 *)
                    std::__cxx11::string::_M_append(local_138,(ulong)local_d0._M_dataplus._M_p);
        }
        local_160 = (undefined1  [8])local_150;
        puVar23 = puVar12 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar12 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar23) {
          local_150._0_8_ = *puVar23;
          local_150._8_8_ = puVar12[3];
        }
        else {
          local_150._0_8_ = *puVar23;
          local_160 = (undefined1  [8])*puVar12;
        }
        local_158._M_p = (pointer)puVar12[1];
        *puVar12 = puVar23;
        puVar12[1] = 0;
        *(undefined1 *)puVar23 = 0;
        Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,(string *)local_160);
        if (local_160 != (undefined1  [8])local_150) {
          operator_delete((void *)local_160,(ulong)(local_150._0_8_ + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._M_dataplus._M_p != paVar2) {
          operator_delete(local_d0._M_dataplus._M_p,
                          (ulong)(local_d0.field_2._M_allocated_capacity + 1));
        }
        if (local_138 != (undefined1  [8])local_128) {
          operator_delete((void *)local_138,(ulong)(local_128._0_8_ + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_110._M_dataplus._M_p != &local_110.field_2) {
          operator_delete(local_110._M_dataplus._M_p,
                          (ulong)(local_110.field_2._M_allocated_capacity + 1));
        }
        local_a8.field_2._M_allocated_capacity = local_f0.field_2._M_allocated_capacity;
        local_a8._M_dataplus._M_p = local_f0._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f0._M_dataplus._M_p == &local_f0.field_2) {
          return __return_storage_ptr__;
        }
        goto LAB_0028911b;
      }
      pSVar29 = ((pFVar6->Type_).sequencetype_)->sizerange_;
      if (pSVar29 == (SizeRange *)0x0) {
        pSVar29 = (SizeRange *)&Specification::_SizeRange_default_instance_;
      }
      validateSizeRange((Result *)local_160,pSVar29);
      bVar10 = Result::good((Result *)local_160);
      if (bVar10) {
        if (pFVar6->_oneof_case_[0] == 7) {
          pAVar17 = (pFVar6->Type_).multiarraytype_;
        }
        else {
          pAVar17 = (ArrayFeatureType *)Specification::SequenceFeatureType::default_instance();
        }
        if (pAVar17->datatype_ != 0) {
          if (local_158._M_p != local_150 + 8) {
            operator_delete(local_158._M_p,(ulong)(local_150._8_8_ + 1));
          }
          goto switchD_00288fd2_caseD_1;
        }
        std::operator+(&local_110,"Description of sequence feature \'",(desc->name_).ptr_);
        puVar12 = (undefined8 *)std::__cxx11::string::append((char *)&local_110);
        puVar23 = puVar12 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar12 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar23) {
          local_128._0_8_ = *puVar23;
          local_128._8_8_ = puVar12[3];
          local_138 = (undefined1  [8])local_128;
        }
        else {
          local_128._0_8_ = *puVar23;
          local_138 = (undefined1  [8])*puVar12;
        }
        local_130._M_p = (pointer)puVar12[1];
        *puVar12 = puVar23;
        puVar12[1] = 0;
        *(undefined1 *)(puVar12 + 2) = 0;
        Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,(string *)local_138);
        if (local_138 != (undefined1  [8])local_128) {
          operator_delete((void *)local_138,(ulong)(local_128._0_8_ + 1));
        }
        uVar30 = local_110.field_2._M_allocated_capacity;
        _Var32._M_p = local_110._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_110._M_dataplus._M_p != &local_110.field_2) goto LAB_0028a581;
      }
      else {
        std::operator+(&local_f0,"Description of sequence feature \'",(desc->name_).ptr_);
        puVar12 = (undefined8 *)std::__cxx11::string::append((char *)&local_f0);
        puVar23 = puVar12 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar12 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar23) {
          local_110.field_2._M_allocated_capacity = *puVar23;
          local_110.field_2._8_8_ = puVar12[3];
          local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
        }
        else {
          local_110.field_2._M_allocated_capacity = *puVar23;
          local_110._M_dataplus._M_p = (pointer)*puVar12;
        }
        local_110._M_string_length = puVar12[1];
        *puVar12 = puVar23;
        puVar12[1] = 0;
        *(undefined1 *)(puVar12 + 2) = 0;
        psVar18 = Result::message_abi_cxx11_((Result *)local_160);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_138,&local_110,psVar18);
        Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,(string *)local_138);
        if (local_138 != (undefined1  [8])local_128) {
          operator_delete((void *)local_138,(ulong)(local_128._0_8_ + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_110._M_dataplus._M_p != &local_110.field_2) {
          operator_delete(local_110._M_dataplus._M_p,
                          (ulong)(local_110.field_2._M_allocated_capacity + 1));
        }
        uVar30 = local_f0.field_2._M_allocated_capacity;
        _Var32._M_p = local_f0._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
LAB_0028a581:
          operator_delete(_Var32._M_p,(ulong)(uVar30 + 1));
        }
      }
      goto LAB_0028a592;
    }
  }
LAB_002890f1:
  if (local_160 != (undefined1  [8])local_150) {
    operator_delete((void *)local_160,(ulong)(local_150._0_8_ + 1));
  }
  local_a8.field_2._M_allocated_capacity = local_128._0_8_;
  local_a8._M_dataplus._M_p = (pointer)local_138;
  if (local_138 == (undefined1  [8])local_128) {
    return __return_storage_ptr__;
  }
  goto LAB_0028911b;
  while( true ) {
    if (uVar22 < 10000) goto LAB_0028b486;
    bVar10 = uVar22 < 100000;
    uVar9 = uVar34 + 4;
    uVar22 = uVar22 / 10000;
    if (bVar10) break;
LAB_0028a878:
    uVar34 = uVar9;
    if (uVar22 < 100) {
      uVar34 = uVar34 - 2;
      goto LAB_0028b486;
    }
    if (uVar22 < 1000) {
      uVar34 = uVar34 - 1;
      goto LAB_0028b486;
    }
  }
  uVar34 = uVar34 + 1;
LAB_0028b486:
  local_80._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct((ulong)&local_80,(char)uVar34);
  std::__detail::__to_chars_10_impl<unsigned_int>(local_80._M_dataplus._M_p,uVar34,uVar28);
  uVar30 = (undefined1 *)0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != paVar2) {
    uVar30 = local_d0.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar30 < (undefined1 *)(local_80._M_string_length + local_d0._M_string_length)) {
    uVar30 = (undefined1 *)0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != paVar3) {
      uVar30 = local_80.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar30 < (undefined1 *)(local_80._M_string_length + local_d0._M_string_length))
    goto LAB_0028b514;
    puVar12 = (undefined8 *)
              std::__cxx11::string::replace
                        ((ulong)&local_80,0,(char *)0x0,(ulong)local_d0._M_dataplus._M_p);
  }
  else {
LAB_0028b514:
    puVar12 = (undefined8 *)
              std::__cxx11::string::_M_append((char *)&local_d0,(ulong)local_80._M_dataplus._M_p);
  }
  puVar23 = puVar12 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar12 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar23) {
    local_f0.field_2._M_allocated_capacity = *puVar23;
    local_f0.field_2._8_8_ = puVar12[3];
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  }
  else {
    local_f0.field_2._M_allocated_capacity = *puVar23;
    local_f0._M_dataplus._M_p = (pointer)*puVar12;
  }
  local_f0._M_string_length = puVar12[1];
  *puVar12 = puVar23;
  puVar12[1] = 0;
  *(undefined1 *)puVar23 = 0;
  puVar12 = (undefined8 *)std::__cxx11::string::append((char *)&local_f0);
  puVar23 = puVar12 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar12 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar23) {
    local_110.field_2._M_allocated_capacity = *puVar23;
    local_110.field_2._8_8_ = puVar12[3];
    local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
  }
  else {
    local_110.field_2._M_allocated_capacity = *puVar23;
    local_110._M_dataplus._M_p = (pointer)*puVar12;
  }
  local_110._M_string_length = puVar12[1];
  *puVar12 = puVar23;
  puVar12[1] = 0;
  *(undefined1 *)(puVar12 + 2) = 0;
  psVar18 = Result::message_abi_cxx11_((Result *)local_160);
  puVar12 = (undefined8 *)
            std::__cxx11::string::_M_append((char *)&local_110,(ulong)(psVar18->_M_dataplus)._M_p);
  puVar23 = puVar12 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar12 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar23) {
    local_128._0_8_ = *puVar23;
    local_128._8_8_ = puVar12[3];
    local_138 = (undefined1  [8])local_128;
  }
  else {
    local_128._0_8_ = *puVar23;
    local_138 = (undefined1  [8])*puVar12;
  }
  local_130._M_p = (pointer)puVar12[1];
  *puVar12 = puVar23;
  puVar12[1] = 0;
  *(undefined1 *)(puVar12 + 2) = 0;
  Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,(string *)local_138);
  if (local_138 != (undefined1  [8])local_128) {
    operator_delete((void *)local_138,(ulong)(local_128._0_8_ + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p,(ulong)(local_110.field_2._M_allocated_capacity + 1))
    ;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p,(ulong)(local_f0.field_2._M_allocated_capacity + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != paVar3) {
    operator_delete(local_80._M_dataplus._M_p,(ulong)(local_80.field_2._M_allocated_capacity + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != paVar2) {
    operator_delete(local_d0._M_dataplus._M_p,(ulong)(local_d0.field_2._M_allocated_capacity + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p,(ulong)(local_a8.field_2._M_allocated_capacity + 1));
  }
LAB_0028a592:
  local_a8.field_2._M_allocated_capacity = local_150._8_8_;
  local_a8._M_dataplus._M_p = local_158._M_p;
  if (local_158._M_p == local_150 + 8) {
    return __return_storage_ptr__;
  }
LAB_0028911b:
  operator_delete(local_a8._M_dataplus._M_p,(ulong)(local_a8.field_2._M_allocated_capacity + 1));
  return __return_storage_ptr__;
}

Assistant:

Result validateFeatureDescription(const Specification::FeatureDescription& desc, int modelVersion, bool isInput) {
        if (desc.name() == "") {
            return Result(ResultType::INVALID_MODEL_INTERFACE,
                          "Feature description must have a non-empty name.");
        }

        if (!desc.has_type()) {
            return Result(ResultType::INVALID_MODEL_INTERFACE,
                          "Feature description " + desc.name() + " must specify a valid feature type.");
        }

        const auto& type = desc.type();
        switch (type.Type_case()) {
            case Specification::FeatureType::kDoubleType:
            case Specification::FeatureType::kInt64Type:
            case Specification::FeatureType::kStringType:
                // in general, non-parametric types need no further validation
                break;

            case Specification::FeatureType::kMultiArrayType:
            {
                const auto &defaultShape = type.multiarraytype().shape();
                bool hasExplicitDefault = (type.multiarraytype().shape_size() != 0);
                bool hasImplictDefault = false;
                // Newer versions use the updated shape constraints for images and multi-arrays
                if (modelVersion >= MLMODEL_SPECIFICATION_VERSION_IOS12) {

                    switch (type.multiarraytype().ShapeFlexibility_case()) {

                        case Specification::ArrayFeatureType::kEnumeratedShapes: {

                            hasImplictDefault = true;

                            if (type.multiarraytype().enumeratedshapes().shapes_size() == 0) {
                                return Result(ResultType::INVALID_MODEL_INTERFACE,
                                              "Description of multiarray feature '" + desc.name() + "' has enumerated zero permitted sizes.");
                            }

                            for (auto &shape : type.multiarraytype().enumeratedshapes().shapes()) {
                                if (shape.shape_size() == 0) {
                                    return Result(ResultType::INVALID_MODEL_INTERFACE,
                                                  "Description of multiarray feature '" + desc.name() + "' has enumerated shapes with zero dimensions.");
                                }
                            }

                            if (!hasExplicitDefault) {
                                break;
                            }

                            bool foundDefault = false;
                            for (auto &shape : type.multiarraytype().enumeratedshapes().shapes()) {
                                if (shape.shape_size() != defaultShape.size()) { continue; }
                                foundDefault = true;
                                for (int d = 0; d < shape.shape_size(); d++) {
                                    if (defaultShape[d] != shape.shape(d)) { foundDefault = false; break; }
                                }
                                if (foundDefault) { break; }
                            }

                            if (!foundDefault) {
                                return Result(ResultType::INVALID_MODEL_INTERFACE,
                                              "Description of multiarray feature '" + desc.name() + "' has a default shape specified " +
                                              " which is not within the allowed enumerated shapes specified.");
                            }

                            break;
                        }
                        case Specification::ArrayFeatureType::kShapeRange: {

                            hasImplictDefault = true;

                            const auto& sizeRanges = type.multiarraytype().shaperange().sizeranges();
                            for (int i = 0; i < sizeRanges.size(); i++) {
                                const auto &range = sizeRanges[i];
                                Result res = validateSizeRange(range);
                                if (!res.good()) {
                                    return Result(ResultType::INVALID_MODEL_INTERFACE,
                                                  "Description of multiarray feature '" + desc.name() +
                                                  "' has an invalid range for dimension " + std::to_string(i) + ". " +
                                                  res.message());
                                }
                            }

                            if (!hasExplicitDefault) {
                                break;
                            }

                            // Check if default is compatible
                            if (defaultShape.size() != sizeRanges.size()) {
                                return Result(ResultType::INVALID_MODEL_INTERFACE,
                                              "Description of multiarray feature '" + desc.name() +
                                              "' has a default " + std::to_string(defaultShape.size()) + "-d shape but a " +
                                              std::to_string(sizeRanges.size()) + "-d shape range");
                            }

                             for (int i = 0; i < sizeRanges.size(); i++) {
                                 if (defaultShape[i] < (int)sizeRanges[i].lowerbound() ||
                                     (sizeRanges[i].upperbound() >= 0 && defaultShape[i] > sizeRanges[i].upperbound())) {

                                     return Result(ResultType::INVALID_MODEL_INTERFACE,
                                                   "Description of multiarray feature '" + desc.name() +
                                                   "' has a default shape that is out of the specified shape range");
                                 }
                             }

                            break;
                        }
                        case Specification::ArrayFeatureType::SHAPEFLEXIBILITY_NOT_SET:
                            break;
                    }

                }

                if (isInput && !hasExplicitDefault && !hasImplictDefault) {
                    return Result(ResultType::INVALID_MODEL_INTERFACE,
                                  "Description of multiarray feature '" + desc.name() + "' has missing shape constraints.");
                }

                if (hasExplicitDefault) {
                    for (int i=0; i < type.multiarraytype().shape_size(); i++) {
                        const auto &value = type.multiarraytype().shape(i);
                        if (value < 0) {
                            return Result(ResultType::INVALID_MODEL_INTERFACE,
                                          "Description of multiarray feature '" + desc.name() + "' has an invalid shape. "
                                          "Element " + std::to_string(i) + " has non-positive value " + std::to_string(value) + ".");
                        }
                    }
                }

                switch (type.multiarraytype().datatype()) {
                    case Specification::ArrayFeatureType_ArrayDataType_DOUBLE:
                    case Specification::ArrayFeatureType_ArrayDataType_FLOAT32:
                    case Specification::ArrayFeatureType_ArrayDataType_INT32:
                        break;
                    case Specification::ArrayFeatureType_ArrayDataType_FLOAT16:
                        if (modelVersion < MLMODEL_SPECIFICATION_VERSION_IOS16) {
                            return Result(ResultType::INVALID_MODEL_INTERFACE,
                                          "Description of multiarray feature '" + desc.name() +
                                          "' has FLOAT16 dataType, which is only valid in specification version >= " += std::to_string(MLMODEL_SPECIFICATION_VERSION_IOS16)+
                                          ". This model has version " + std::to_string(modelVersion));
                        }

                        break;
                    default:
                        return Result(ResultType::INVALID_MODEL_INTERFACE,
                                      "Description of multiarray feature '" + desc.name() + "' has an invalid or unspecified dataType. "
                                      "It must be specified as DOUBLE, FLOAT32, FLOAT16 or INT32");
                }

                switch (type.multiarraytype().defaultOptionalValue_case()) {
                    case CoreML::Specification::ArrayFeatureType::kDoubleDefaultValue:
                        if (type.multiarraytype().datatype() != Specification::ArrayFeatureType_ArrayDataType_DOUBLE){
                            return Result(ResultType::INVALID_MODEL_INTERFACE,
                                          "Description of multiarray feature '" + desc.name() + "' has mistmatch"
                                          " between dataType and the type of default optional value.");
                        }
                        break;
                    case CoreML::Specification::ArrayFeatureType::kFloatDefaultValue:
                        if (type.multiarraytype().datatype() != Specification::ArrayFeatureType_ArrayDataType_FLOAT32 &&
                            type.multiarraytype().datatype() != Specification::ArrayFeatureType_ArrayDataType_FLOAT16){
                            return Result(ResultType::INVALID_MODEL_INTERFACE,
                                          "Description of multiarray feature '" + desc.name() + "' has mistmatch"
                                          " between dataType and the type of default optional value.");
                        }
                        break;
                    case CoreML::Specification::ArrayFeatureType::kIntDefaultValue:
                        if (type.multiarraytype().datatype() != Specification::ArrayFeatureType_ArrayDataType_INT32){
                            return Result(ResultType::INVALID_MODEL_INTERFACE,
                                          "Description of multiarray feature '" + desc.name() + "' has mistmatch"
                                          " between dataType and the type of default optional value.");
                        }
                        break;
                    default:
                        break;
                }
                
                break;

            }
            case Specification::FeatureType::kDictionaryType:
                switch (type.dictionarytype().KeyType_case()) {
                    case Specification::DictionaryFeatureType::KeyTypeCase::kInt64KeyType:
                    case Specification::DictionaryFeatureType::KeyTypeCase::kStringKeyType:
                        break;
                    case Specification::DictionaryFeatureType::KeyTypeCase::KEYTYPE_NOT_SET:
                        return Result(ResultType::INVALID_MODEL_INTERFACE,
                                      "Description of dictionary feature '" + desc.name() + "' must contain a key type of either Int64 or String.");
                }
                break;

            case Specification::FeatureType::kImageType: {

                int64_t defaultWidth = type.imagetype().width();
                int64_t defaultHeight = type.imagetype().height();
                bool hasDefault = (defaultWidth > 0 && defaultHeight > 0);

                if (modelVersion >= MLMODEL_SPECIFICATION_VERSION_IOS12) {

                    switch (type.imagetype().SizeFlexibility_case()) {

                        case Specification::ImageFeatureType::kEnumeratedSizes: {

                            if (type.imagetype().enumeratedsizes().sizes_size() == 0) {
                                return Result(ResultType::INVALID_MODEL_INTERFACE,
                                              "Description of image feature '" + desc.name() + "' has enumerated zero permitted sizes.");
                            }

                            if (!hasDefault) {
                                defaultWidth = (int64_t)type.imagetype().enumeratedsizes().sizes(0).width();
                                defaultHeight = (int64_t)type.imagetype().enumeratedsizes().sizes(0).height();
                                break;
                            }

                            bool foundDefault = false;
                            for (auto &size : type.imagetype().enumeratedsizes().sizes()) {
                                if (defaultWidth == (int64_t)size.width() && defaultHeight == (int64_t)size.height()) {
                                    foundDefault = true;
                                    break;
                                }
                            }

                            if (!foundDefault) {
                                return Result(ResultType::INVALID_MODEL_INTERFACE,
                                              "Description of image feature '" + desc.name() + "' has a default size of " +
                                              std::to_string(defaultWidth) + " × " + std::to_string(defaultHeight) +
                                              " which is not within the allowed enumerated sizes specified.");
                            }

                            break;
                        }
                        case Specification::ImageFeatureType::kImageSizeRange:
                        {
                            const auto& widthRange = type.imagetype().imagesizerange().widthrange();
                            Result res = validateSizeRange(widthRange);
                            if (!res.good()) {
                                return Result(ResultType::INVALID_MODEL_INTERFACE,
                                              "Description of image feature '" + desc.name() + "' has an invalid flexible width range. "
                                               + res.message());
                            }

                            const auto& heightRange = type.imagetype().imagesizerange().heightrange();
                            res = validateSizeRange(heightRange);
                            if (!res.good()) {
                                return Result(ResultType::INVALID_MODEL_INTERFACE,
                                              "Description of image feature '" + desc.name() + "' has an invalid flexible height range. "
                                              + res.message());
                            }

                            if (!hasDefault) {
                                defaultWidth = (int64_t)widthRange.lowerbound();
                                defaultHeight = (int64_t)heightRange.lowerbound();
                                break;
                            }

                            if (defaultWidth < (int64_t)widthRange.lowerbound() ||
                                (widthRange.upperbound() >=0 && defaultWidth > widthRange.upperbound())) {
                                return Result(ResultType::INVALID_MODEL_INTERFACE,
                                              "Description of image feature '" + desc.name() + "' default width "
                                              + std::to_string(defaultWidth) + " is not within specified flexible width range");
                            }

                            if (defaultHeight < (int64_t)heightRange.lowerbound() ||
                                (heightRange.upperbound() >=0 && defaultHeight > heightRange.upperbound())) {
                                return Result(ResultType::INVALID_MODEL_INTERFACE,
                                              "Description of image feature '" + desc.name() + "' default height "
                                              + std::to_string(defaultHeight) + " is not within specified flexible height range");
                            }


                            break;
                        }
                        default:
                            break;
                    }

                }

                if (defaultWidth <= 0) {
                    return Result(ResultType::INVALID_MODEL_INTERFACE,
                                  "Description of image feature '" + desc.name() +
                                  "' has missing or non-positive width " + std::to_string(type.imagetype().width()) + ".");
                }

                if (defaultHeight <= 0) {
                    return Result(ResultType::INVALID_MODEL_INTERFACE,
                                  "Description of image feature '" + desc.name() +
                                  "' has missing or non-positive height " + std::to_string(type.imagetype().height()) + ".");
                }

                switch (type.imagetype().colorspace()) {
                    case Specification::ImageFeatureType_ColorSpace_GRAYSCALE:
                    case Specification::ImageFeatureType_ColorSpace_RGB:
                    case Specification::ImageFeatureType_ColorSpace_BGR:
                        break;
                    case Specification::ImageFeatureType_ColorSpace_GRAYSCALE_FLOAT16:
                        if (modelVersion < MLMODEL_SPECIFICATION_VERSION_IOS16) {
                            return Result(ResultType::INVALID_MODEL_INTERFACE,
                                          "Description of image feature '" + desc.name() +
                                          "' has GRAYSCALE_FLOAT16 colorspace, which is only valid in specification version >= " += std::to_string(MLMODEL_SPECIFICATION_VERSION_IOS16)+
                                          ". This model has version " + std::to_string(modelVersion));
                        }
                        break;
                    default:
                        return Result(ResultType::INVALID_MODEL_INTERFACE,
                                      "Description of image feature '" + desc.name() +
                                      "' has missing or invalid colorspace. It must be RGB, BGR or GRAYSCALE.");
                }
                break;
            }
            case Specification::FeatureType::kSequenceType: {

                if (modelVersion < MLMODEL_SPECIFICATION_VERSION_IOS12) {
                    return  Result(ResultType::INVALID_MODEL_INTERFACE,
                                   "Sequence types are only valid in specification verison >= " + std::to_string(MLMODEL_SPECIFICATION_VERSION_IOS12)+
                                   ". This model has version " + std::to_string(modelVersion));
                }

                // Validate size
                Result res = validateSizeRange(type.sequencetype().sizerange());
                if (!res.good()) {
                    return Result(ResultType::INVALID_MODEL_INTERFACE,
                                  "Description of sequence feature '" + desc.name() + "' has invalid allowed sizes. "
                                  + res.message());
                }

                // Validate type

                switch (type.sequencetype().Type_case()) {
                    case Specification::SequenceFeatureType::kInt64Type:
                    case Specification::SequenceFeatureType::kStringType:
                        break;
                    case Specification::SequenceFeatureType::TYPE_NOT_SET:
                        return Result(ResultType::INVALID_MODEL_INTERFACE,
                                      "Description of sequence feature '" + desc.name() + "' has invalid or missing type. "
                                      "Only Int64 and String sequences are currently supported");


                }
                break;
            }
            case Specification::FeatureType::TYPE_NOT_SET:
                // these aren't equal to anything, even themselves
                return Result(ResultType::INVALID_MODEL_INTERFACE,
                              "Feature description has an unspecified or invalid type for feature '" + desc.name() + "'.");
        }

        // If we got here, the feature description is valid.
        return Result();
    }